

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  pointer *__return_storage_ptr__;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx;
  uint32_t sequence_00;
  uint32_t utxo_index;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  uchar *txhash;
  uchar *script;
  size_type script_len;
  string *in_stack_fffffffffffffaf0;
  string *message;
  undefined8 in_stack_fffffffffffffaf8;
  CfdError CVar5;
  CfdException *in_stack_fffffffffffffb00;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb30;
  uint32_t local_494;
  ConfidentialTxIn local_420;
  undefined1 local_2c0 [8];
  ConfidentialTxIn txin;
  size_t sStack_158;
  uint32_t set_index;
  size_t is_coinbase;
  string local_148 [32];
  CfdSourceLocation local_128;
  int local_110;
  byte local_109;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *txid_buf;
  wally_tx *tx_pointer;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  Script *local_28;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  ConfidentialTransaction *this_local;
  
  CVar5 = (CfdError)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_28 = unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  sVar3 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
          size(&this->vin_);
  uVar2 = ::std::numeric_limits<unsigned_int>::max();
  if (sVar3 == uVar2) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x613;
    local_40.funcname = "AddTxIn";
    logger::warn<>(&local_40,"vin maximum.");
    tx_pointer._3_1_ = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"txin maximum.",&local_61);
    CfdException::CfdException(in_stack_fffffffffffffb00,CVar5,in_stack_fffffffffffffaf0);
    tx_pointer._3_1_ = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  txid_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (this->super_AbstractTransaction).wally_tx_pointer_;
  __return_storage_ptr__ =
       &empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  Txid::GetData((ByteData *)__return_storage_ptr__,_sequence_local);
  ByteData::GetBytes(&local_a0,(ByteData *)__return_storage_ptr__);
  ByteData::~ByteData((ByteData *)0x4d396f);
  local_88 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4d3986);
  local_109 = 0;
  bVar1 = Script::IsEmpty(local_28);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  }
  else {
    Script::GetData((ByteData *)&ret,local_28);
    local_109 = 1;
    ByteData::GetBytes(&local_f0,(ByteData *)&ret);
  }
  if ((local_109 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4d3a08);
  }
  tx = txid_buf;
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0;
  txhash = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_88);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_88);
  utxo_index = unlocking_script_local._4_4_;
  sequence_00 = (uint32_t)unlocking_script_local;
  script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
  script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  this_00 = (CfdException *)0x0;
  CVar5 = kCfdSuccess;
  message = (string *)0x0;
  local_110 = wally_tx_add_elements_raw_input
                        ((wally_tx *)tx,txhash,sVar3,utxo_index,sequence_00,script,script_len,
                         (wally_tx_witness_stack *)0x0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                         (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                         0);
  if (local_110 == 0) {
    sStack_158 = 0;
    wally_tx_is_coinbase((wally_tx *)txid_buf,&stack0xfffffffffffffea8);
    if (sStack_158 == 0) {
      local_494 = unlocking_script_local._4_4_ & 0x3fffffff;
    }
    else {
      local_494 = unlocking_script_local._4_4_;
    }
    txin.pegin_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_494;
    ConfidentialTxIn::ConfidentialTxIn
              ((ConfidentialTxIn *)local_2c0,_sequence_local,local_494,
               (uint32_t)unlocking_script_local);
    bVar1 = Script::IsEmpty(local_28);
    if (!bVar1) {
      ConfidentialTxIn::ConfidentialTxIn
                (&local_420,_sequence_local,
                 txin.pegin_witness_.witness_stack_.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 (uint32_t)unlocking_script_local,local_28);
      ConfidentialTxIn::operator=((ConfidentialTxIn *)local_2c0,&local_420);
      ConfidentialTxIn::~ConfidentialTxIn(&local_420);
    }
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    push_back(&this->vin_,(value_type *)local_2c0);
    sVar3 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::size(&this->vin_);
    ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_2c0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return (int)sVar3 - 1;
  }
  local_128.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_128.filename = local_128.filename + 1;
  local_128.line = 0x623;
  local_128.funcname = "AddTxIn";
  logger::warn<int&>(&local_128,"wally_tx_add_elements_raw_input NG[{}].",&local_110);
  is_coinbase._6_1_ = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_148,"txin add error.",(allocator *)((long)&is_coinbase + 7));
  CfdException::CfdException(this_00,CVar5,message);
  is_coinbase._6_1_ = 0;
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}